

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

Token * __thiscall Lexer::match_digit(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  lexer_exception *this_00;
  Type local_1f4;
  string res;
  string local_1d0;
  stringstream buffer;
  ostream local_1a0 [8];
  string local_198 [368];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
  cVar1 = this->current_;
  do {
    std::operator<<(local_1a0,cVar1);
    res._M_dataplus._M_p._0_1_ = 0;
    consume(this,(bool *)&res);
    cVar1 = this->current_;
  } while (cVar1 == '.' || (byte)(cVar1 - 0x30U) < 10);
  std::__cxx11::stringbuf::str();
  bVar2 = Recognition::is_integer(&res);
  if (bVar2) {
    local_1f4 = kIntegerLiteral;
    local_1d0._M_string_length._0_4_ = (this->position_).super_Position.row_;
    local_1d0._M_string_length._4_4_ = (this->position_).super_Position.col_;
    local_1d0._M_dataplus._M_p = (pointer)&PTR_clear_001599f0;
    local_1d0.field_2._M_allocated_capacity._0_4_ = (undefined4)res._M_string_length;
    Token::Token(__return_storage_ptr__,&local_1f4,&res,(TokenPosition *)&local_1d0);
  }
  else {
    bVar2 = Recognition::is_real(&res);
    if (!bVar2) {
      std::__cxx11::string::string((string *)&local_1d0,"",(allocator *)&local_1f4);
      std::__cxx11::stringbuf::str(local_198);
      std::__cxx11::string::~string((string *)&local_1d0);
      poVar3 = std::operator<<(local_1a0,anon_var_dwarf_3abeb);
      poVar3 = std::operator<<(poVar3,(string *)&res);
      std::operator<<(poVar3,"\"");
      this_00 = (lexer_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      lexer_exception::lexer_exception(this_00,&this->position_,&local_1d0);
      __cxa_throw(this_00,&lexer_exception::typeinfo,lexer_exception::~lexer_exception);
    }
    local_1f4 = kRealLiteral;
    local_1d0._M_string_length._0_4_ = (this->position_).super_Position.row_;
    local_1d0._M_string_length._4_4_ = (this->position_).super_Position.col_;
    local_1d0._M_dataplus._M_p = (pointer)&PTR_clear_001599f0;
    local_1d0.field_2._M_allocated_capacity._0_4_ = (undefined4)res._M_string_length;
    Token::Token(__return_storage_ptr__,&local_1f4,&res,(TokenPosition *)&local_1d0);
  }
  std::__cxx11::string::~string((string *)&res);
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::match_digit() {
    std::stringstream buffer;
    do {
        buffer << current_;
        consume(false);
    } while (Recognition::is_digit(current_) || Recognition::is_dot(current_));

    std::string res = buffer.str();
    int length = (int)res.length();
    if (Recognition::is_integer(res)) {
        return Token(Token::Type::kIntegerLiteral, res, TokenPosition(position_, length));
    } else if (Recognition::is_real(res)) {
        return Token(Token::Type::kRealLiteral, res, TokenPosition(position_, length));
    } else {
        buffer.str("");
        buffer << "不正确的数字: \"" << res << "\"";
        throw lexer_exception(position_, buffer.str());
    }
}